

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          int num_digits,string_view prefix,basic_format_specs<wchar_t> *spec,num_writer f)

{
  alignment aVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  align_spec local_60;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
  local_50;
  
  local_50.prefix.size_ = prefix.size_;
  local_50.prefix.data_ = prefix.data_;
  uVar5 = (uint)num_digits + local_50.prefix.size_;
  local_50.fill = (spec->super_align_spec).fill_;
  aVar1 = (spec->super_align_spec).align_;
  if (aVar1 == ALIGN_NUMERIC) {
    uVar3 = (ulong)(spec->super_align_spec).width_;
    local_50.size_ = uVar3;
    if (uVar3 < uVar5) {
      local_50.size_ = uVar5;
    }
    local_50.padding = 0;
    if (uVar5 <= uVar3) {
      local_50.padding = uVar3 - uVar5;
    }
    local_60.align_ = (spec->super_align_spec).align_;
    local_60.width_ = (spec->super_align_spec).width_;
    local_60.fill_ = (spec->super_align_spec).fill_;
  }
  else {
    uVar2 = (spec->super_core_format_specs).precision;
    uVar4 = uVar2 - num_digits;
    local_50.size_ = uVar5;
    if (uVar4 != 0 && num_digits <= (int)uVar2) {
      local_50.fill = L'0';
      local_50.size_ = uVar2 + local_50.prefix.size_;
    }
    local_50.padding = (ulong)uVar4;
    if (uVar4 == 0 || (int)uVar2 < num_digits) {
      local_50.padding = 0;
    }
    local_60.align_ = (spec->super_align_spec).align_;
    local_60.width_ = (spec->super_align_spec).width_;
    local_60.fill_ = (spec->super_align_spec).fill_;
    if (aVar1 == ALIGN_DEFAULT) {
      local_60.align_ = ALIGN_RIGHT;
    }
  }
  local_50.f.abs_value = f.abs_value;
  local_50.f.size = f.size;
  local_50.f.sep = f.sep;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>>
            (this,&local_60,&local_50);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }